

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_ntlm.c
# Opt level: O3

CURLcode Curl_output_ntlm(Curl_easy *data,_Bool proxy)

{
  byte *pbVar1;
  int iVar2;
  connectdata *pcVar3;
  proxy_info *ppVar4;
  long lVar5;
  CURLcode CVar6;
  uchar *puVar7;
  size_t sVar8;
  char *service;
  ulong uVar9;
  undefined7 in_register_00000031;
  char *passwdp;
  char *pcVar10;
  ntlmdata *ntlm;
  char *base64;
  size_t len;
  bufref ntlmmsg;
  char *local_88;
  int local_7c;
  long local_78;
  long local_70;
  long local_68;
  size_t local_60;
  bufref local_58;
  char *local_40;
  char *local_38;
  
  local_88 = (char *)0x0;
  local_60 = 0;
  pcVar3 = data->conn;
  local_7c = (int)CONCAT71(in_register_00000031,proxy);
  local_68 = (ulong)(uint)(local_7c << 5) + 0xdc0;
  local_78 = 0x12a8;
  if (local_7c != 0) {
    local_78 = 0x1290;
  }
  uVar9 = CONCAT71(in_register_00000031,proxy) & 0xffffffff;
  local_40 = (data->set).str[(ulong)!proxy + 0x38];
  ntlm = &pcVar3->proxyntlm;
  ppVar4 = &pcVar3->http_proxy;
  if (local_7c == 0) {
    ntlm = &pcVar3->ntlm;
    ppVar4 = (proxy_info *)&pcVar3->host;
  }
  pcVar10 = *(char **)((long)&(data->state).aptr.user + (ulong)(uint)(local_7c << 4));
  passwdp = *(char **)((long)&(data->state).aptr.passwd + (ulong)(uint)(local_7c << 4));
  local_38 = (ppVar4->host).name;
  pbVar1 = &(data->state).authhost.field_0x18 + (uint)(local_7c << 5);
  *pbVar1 = *pbVar1 & 0xfe;
  if (pcVar10 == (char *)0x0) {
    pcVar10 = "";
  }
  local_70 = uVar9 * 4 + 0x3f0;
  if (passwdp == (char *)0x0) {
    passwdp = "";
  }
  Curl_bufref_init(&local_58);
  lVar5 = local_78;
  iVar2 = *(int *)((pcVar3->ntlm).nonce + uVar9 * 4 + -0xc);
  if (iVar2 == 2) {
    CVar6 = Curl_auth_create_ntlm_type3_message(data,pcVar10,passwdp,ntlm,&local_58);
    if (CVar6 != CURLE_OK) goto LAB_005c6fed;
    sVar8 = Curl_bufref_len(&local_58);
    if (sVar8 != 0) {
      puVar7 = Curl_bufref_ptr(&local_58);
      sVar8 = Curl_bufref_len(&local_58);
      CVar6 = Curl_base64_encode((char *)puVar7,sVar8,&local_88,&local_60);
      lVar5 = local_78;
      if (CVar6 == CURLE_OK) {
        (*Curl_cfree)(*(void **)((long)&data->magic + local_78));
        pcVar10 = "";
        if ((char)local_7c != '\0') {
          pcVar10 = "Proxy-";
        }
        CVar6 = CURLE_OK;
        pcVar10 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar10,local_88);
        *(char **)((long)&data->magic + lVar5) = pcVar10;
        (*Curl_cfree)(local_88);
        if (*(long *)((long)&data->magic + lVar5) == 0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
        }
        else {
          pcVar10 = (pcVar3->chunk).hexbuffer + local_70 + -0x3d;
          pcVar10[0] = '\x03';
          pcVar10[1] = '\0';
          pcVar10[2] = '\0';
          pcVar10[3] = '\0';
          pbVar1 = (byte *)((long)data->sockets + local_68 + -0x70);
          *pbVar1 = *pbVar1 | 1;
        }
      }
      goto LAB_005c6fed;
    }
  }
  else {
    if (iVar2 != 4) {
      if (iVar2 != 3) {
        service = "HTTP";
        if (local_40 != (char *)0x0) {
          service = local_40;
        }
        CVar6 = Curl_auth_create_ntlm_type1_message
                          (data,pcVar10,passwdp,service,local_38,ntlm,&local_58);
        if (CVar6 == CURLE_OK) {
          puVar7 = Curl_bufref_ptr(&local_58);
          sVar8 = Curl_bufref_len(&local_58);
          CVar6 = Curl_base64_encode((char *)puVar7,sVar8,&local_88,&local_60);
          lVar5 = local_78;
          if (CVar6 == CURLE_OK) {
            (*Curl_cfree)(*(void **)((long)&data->magic + local_78));
            pcVar10 = "";
            if ((char)local_7c != '\0') {
              pcVar10 = "Proxy-";
            }
            pcVar10 = curl_maprintf("%sAuthorization: NTLM %s\r\n",pcVar10,local_88);
            *(char **)((long)&data->magic + lVar5) = pcVar10;
            (*Curl_cfree)(local_88);
            CVar6 = CURLE_OUT_OF_MEMORY;
            if (*(long *)((long)&data->magic + lVar5) != 0) {
              CVar6 = CURLE_OK;
            }
          }
        }
        goto LAB_005c6fed;
      }
      pcVar10 = (pcVar3->chunk).hexbuffer + local_70 + -0x3d;
      pcVar10[0] = '\x04';
      pcVar10[1] = '\0';
      pcVar10[2] = '\0';
      pcVar10[3] = '\0';
    }
    (*Curl_cfree)(*(void **)((long)&data->magic + local_78));
    *(undefined8 *)((long)&data->magic + lVar5) = 0;
    pbVar1 = (byte *)((long)data->sockets + local_68 + -0x70);
    *pbVar1 = *pbVar1 | 1;
  }
  CVar6 = CURLE_OK;
LAB_005c6fed:
  Curl_bufref_free(&local_58);
  return CVar6;
}

Assistant:

CURLcode Curl_output_ntlm(struct Curl_easy *data, bool proxy)
{
  char *base64 = NULL;
  size_t len = 0;
  CURLcode result = CURLE_OK;
  struct bufref ntlmmsg;

  /* point to the address of the pointer that holds the string to send to the
     server, which is for a plain host or for a HTTP proxy */
  char **allocuserpwd;

  /* point to the username, password, service and host */
  const char *userp;
  const char *passwdp;
  const char *service = NULL;
  const char *hostname = NULL;

  /* point to the correct struct with this */
  struct ntlmdata *ntlm;
  curlntlm *state;
  struct auth *authp;
  struct connectdata *conn = data->conn;

  DEBUGASSERT(conn);
  DEBUGASSERT(data);

  if(proxy) {
#ifndef CURL_DISABLE_PROXY
    allocuserpwd = &data->state.aptr.proxyuserpwd;
    userp = data->state.aptr.proxyuser;
    passwdp = data->state.aptr.proxypasswd;
    service = data->set.str[STRING_PROXY_SERVICE_NAME] ?
      data->set.str[STRING_PROXY_SERVICE_NAME] : "HTTP";
    hostname = conn->http_proxy.host.name;
    ntlm = &conn->proxyntlm;
    state = &conn->proxy_ntlm_state;
    authp = &data->state.authproxy;
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  else {
    allocuserpwd = &data->state.aptr.userpwd;
    userp = data->state.aptr.user;
    passwdp = data->state.aptr.passwd;
    service = data->set.str[STRING_SERVICE_NAME] ?
      data->set.str[STRING_SERVICE_NAME] : "HTTP";
    hostname = conn->host.name;
    ntlm = &conn->ntlm;
    state = &conn->http_ntlm_state;
    authp = &data->state.authhost;
  }
  authp->done = FALSE;

  /* not set means empty */
  if(!userp)
    userp = "";

  if(!passwdp)
    passwdp = "";

#ifdef USE_WINDOWS_SSPI
  if(!s_hSecDll) {
    /* not thread safe and leaks - use curl_global_init() to avoid */
    CURLcode err = Curl_sspi_global_init();
    if(!s_hSecDll)
      return err;
  }
#ifdef SECPKG_ATTR_ENDPOINT_BINDINGS
  ntlm->sslContext = conn->sslContext;
#endif
#endif

  Curl_bufref_init(&ntlmmsg);

  /* connection is already authenticated, don't send a header in future
   * requests so go directly to NTLMSTATE_LAST */
  if(*state == NTLMSTATE_TYPE3)
    *state = NTLMSTATE_LAST;

  switch(*state) {
  case NTLMSTATE_TYPE1:
  default: /* for the weird cases we (re)start here */
    /* Create a type-1 message */
    result = Curl_auth_create_ntlm_type1_message(data, userp, passwdp,
                                                 service, hostname,
                                                 ntlm, &ntlmmsg);
    if(!result) {
      DEBUGASSERT(Curl_bufref_len(&ntlmmsg) != 0);
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
      }
    }
    break;

  case NTLMSTATE_TYPE2:
    /* We already received the type-2 message, create a type-3 message */
    result = Curl_auth_create_ntlm_type3_message(data, userp, passwdp,
                                                 ntlm, &ntlmmsg);
    if(!result && Curl_bufref_len(&ntlmmsg)) {
      result = Curl_base64_encode((const char *) Curl_bufref_ptr(&ntlmmsg),
                                  Curl_bufref_len(&ntlmmsg), &base64, &len);
      if(!result) {
        free(*allocuserpwd);
        *allocuserpwd = aprintf("%sAuthorization: NTLM %s\r\n",
                                proxy ? "Proxy-" : "",
                                base64);
        free(base64);
        if(!*allocuserpwd)
          result = CURLE_OUT_OF_MEMORY;
        else {
          *state = NTLMSTATE_TYPE3; /* we send a type-3 */
          authp->done = TRUE;
        }
      }
    }
    break;

  case NTLMSTATE_LAST:
    Curl_safefree(*allocuserpwd);
    authp->done = TRUE;
    break;
  }
  Curl_bufref_free(&ntlmmsg);

  return result;
}